

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LNode.h
# Opt level: O1

void __thiscall
LNodeData<LNodeF0Stmt>::LNodeData(LNodeData<LNodeF0Stmt> *this,LNodeType type,LNodeF0Stmt *value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  (this->super_LNode).type = type;
  (this->super_LNode)._vptr_LNode = (_func_int **)&PTR__LNodeData_001229c8;
  (this->value).var.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->value).var.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->value).from_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->value).from_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->value).to_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->value).to_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->value).stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->value).stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (value->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (value->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (value->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (value->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->value).var.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->value).var.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->value).var.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (value->from_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (value->from_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (value->from_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (value->from_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->value).from_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->value).from_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->value).from_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (value->to_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (value->to_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (value->to_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (value->to_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->value).to_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->value).to_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->value).to_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (value->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (value->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (value->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (value->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->value).stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->value).stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->value).stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

LNodeData(LNodeType type, T &&value) : LNode(type) {
        this->value = std::move(value);
    }